

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3e00dc::AVxFirstPassEncoderThreadTest::AVxFirstPassEncoderThreadTest
          (AVxFirstPassEncoderThreadTest *this)

{
  __tuple_element_t<1UL,_tuple<const_CodecFactory_*,_TestMode,_int,_int,_int>_> *p_Var1;
  __tuple_element_t<2UL,_tuple<const_CodecFactory_*,_TestMode,_int,_int,_int>_> *p_Var2;
  __tuple_element_t<3UL,_tuple<const_CodecFactory_*,_TestMode,_int,_int,_int>_> *p_Var3;
  __tuple_element_t<4UL,_tuple<const_CodecFactory_*,_TestMode,_int,_int,_int>_> *p_Var4;
  __tuple_element_t<4UL,_tuple<const_CodecFactory_*,_TestMode,_int,_int,_int>_> *p_Var5;
  undefined8 *in_RDI;
  CodecFactory *in_stack_ffffffffffffff88;
  EncoderTest *in_stack_ffffffffffffff90;
  
  libaom_test::CodecTestWith4Params<libaom_test::TestMode,_int,_int,_int>::CodecTestWith4Params
            ((CodecTestWith4Params<libaom_test::TestMode,_int,_int,_int> *)in_stack_ffffffffffffff90
            );
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
  ::GetParam();
  std::get<0ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int,int>
            ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int> *)
             0x52e2fc);
  libaom_test::EncoderTest::EncoderTest(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *in_RDI = &PTR__AVxFirstPassEncoderThreadTest_01f4d718;
  in_RDI[2] = &PTR__AVxFirstPassEncoderThreadTest_01f4d780;
  in_RDI[3] = &PTR__AVxFirstPassEncoderThreadTest_01f4d7a0;
  *(undefined1 *)((long)in_RDI + 0x3f4) = 0;
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
  ::GetParam();
  p_Var1 = std::get<1ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>
                       *)0x52e358);
  *(__tuple_element_t<1UL,_tuple<const_CodecFactory_*,_TestMode,_int,_int,_int>_> *)(in_RDI + 0x7f)
       = *p_Var1;
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
  ::GetParam();
  p_Var2 = std::get<2ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>
                       *)0x52e38a);
  *(__tuple_element_t<2UL,_tuple<const_CodecFactory_*,_TestMode,_int,_int,_int>_> *)
   ((long)in_RDI + 0x3fc) = *p_Var2;
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
  ::GetParam();
  p_Var3 = std::get<3ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>
                       *)0x52e3bc);
  *(__tuple_element_t<3UL,_tuple<const_CodecFactory_*,_TestMode,_int,_int,_int>_> *)(in_RDI + 0x80)
       = *p_Var3;
  p_Var4 = (__tuple_element_t<4UL,_tuple<const_CodecFactory_*,_TestMode,_int,_int,_int>_> *)
           ((long)in_RDI + 0x404);
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
  ::GetParam();
  p_Var5 = std::get<4ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>
                       *)0x52e3ee);
  *p_Var4 = *p_Var5;
  in_RDI[0x7c] = 0x10000;
  *(undefined4 *)(in_RDI + 0x81) = 1;
  in_RDI[0x82] = 0;
  in_RDI[0x83] = 0;
  return;
}

Assistant:

AVxFirstPassEncoderThreadTest()
      : EncoderTest(GET_PARAM(0)), encoder_initialized_(false),
        encoding_mode_(GET_PARAM(1)), set_cpu_used_(GET_PARAM(2)),
        tile_rows_(GET_PARAM(3)), tile_cols_(GET_PARAM(4)) {
    init_flags_ = AOM_CODEC_USE_PSNR;

    row_mt_ = 1;
    firstpass_stats_.buf = nullptr;
    firstpass_stats_.sz = 0;
  }